

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionShape.cpp
# Opt level: O2

btScalar __thiscall btCollisionShape::getAngularMotionDisc(btCollisionShape *this)

{
  btScalar bVar1;
  btVector3 center;
  float local_24;
  btVector3 local_20;
  
  (*this->_vptr_btCollisionShape[3])(this,&local_20,&local_24);
  bVar1 = btVector3::length(&local_20);
  return bVar1 + local_24;
}

Assistant:

btScalar	btCollisionShape::getAngularMotionDisc() const
{
	///@todo cache this value, to improve performance
	btVector3	center;
	btScalar disc;
	getBoundingSphere(center,disc);
	disc += (center).length();
	return disc;
}